

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O2

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::MouseEvent,QWindow*,unsigned_long,QPointF,QPointF,QFlags<Qt::MouseButton>,QFlags<Qt::KeyboardModifier>,Qt::MouseButton,QEvent::Type,Qt::MouseEventSource,bool,QPointingDevice_const*>
               (QWindow *args,unsigned_long args_1,QPointF args_2,QPointF args_3,
               QFlags<Qt::MouseButton> args_4,QFlags<Qt::KeyboardModifier> args_5,MouseButton args_6
               ,Type args_7,MouseEventSource args_8,bool args_9,QPointingDevice *args_10)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  undefined1 uVar6;
  undefined8 *puVar7;
  MouseEvent *pMVar8;
  long in_FS_OFFSET;
  byte bVar9;
  MouseEvent event;
  QPointF args_local_1;
  QPointF args_local;
  
  args_local_1.yp = args_3.yp;
  args_local_1.xp = args_3.xp;
  args_local.yp = args_2.yp;
  args_local.xp = args_2.xp;
  bVar9 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = QThread::isMainThread();
  if (cVar2 == '\0') {
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::MouseEvent,QWindow*,unsigned_long,QPointF,QPointF,QFlags<Qt::MouseButton>,QFlags<Qt::KeyboardModifier>,Qt::MouseButton,QEvent::Type,Qt::MouseEventSource,bool,QPointingDevice_const*>
              (args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,args_8,args_9,args_10);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      bVar3 = QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)0x0);
      return bVar3;
    }
  }
  else {
    puVar7 = &DAT_005de008;
    pMVar8 = &event;
    for (lVar5 = 0xf; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pMVar8->super_PointerEvent).super_InputEvent.super_UserEvent.super_WindowSystemEvent.
      _vptr_WindowSystemEvent = (_func_int **)*puVar7;
      puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
      pMVar8 = (MouseEvent *)((long)pMVar8 + (ulong)bVar9 * -0x10 + 8);
    }
    QWindowSystemInterfacePrivate::MouseEvent::MouseEvent
              (&event,args,args_1,&args_local,&args_local_1,
               (MouseButtons)
               args_4.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
               super_QFlagsStorage<Qt::MouseButton>.i,
               (KeyboardModifiers)
               args_5.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
               super_QFlagsStorage<Qt::KeyboardModifier>.i,args_6,args_7,args_8,args_9,args_10,-1);
    if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
      QGuiApplicationPrivate::processWindowSystemEvent((WindowSystemEvent *)&event);
      uVar6 = event.super_PointerEvent.super_InputEvent.super_UserEvent.super_WindowSystemEvent.
              eventAccepted;
    }
    else {
      iVar4 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                        (QWindowSystemInterfacePrivate::eventHandler,&event);
      uVar6 = event.super_PointerEvent.super_InputEvent.super_UserEvent.super_WindowSystemEvent.
              eventAccepted;
      if ((char)iVar4 == '\0') {
        uVar6 = 0;
      }
    }
    QWindowSystemInterfacePrivate::UserEvent::~UserEvent((UserEvent *)&event);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return (bool)uVar6;
    }
  }
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}